

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio.c
# Opt level: O2

void FAudioVoice_GetOutputFilterParameters
               (FAudioVoice *voice,FAudioVoice *pDestinationVoice,
               FAudioFilterParameters *pParameters)

{
  FAudioSendDescriptor *pFVar1;
  uint uVar2;
  long lVar3;
  
  if (voice->type == FAUDIO_VOICE_MASTER) {
    return;
  }
  FAudio_PlatformLockMutex(voice->sendLock);
  uVar2 = (voice->sends).SendCount;
  if (pDestinationVoice == (FAudioVoice *)0x0) {
    if (uVar2 == 1) {
      pDestinationVoice = ((voice->sends).pSends)->pOutputVoice;
      uVar2 = 1;
    }
    else {
      pDestinationVoice = (FAudioVoice *)0x0;
    }
  }
  lVar3 = 0;
  do {
    if ((ulong)uVar2 * 0xc - lVar3 == 0) {
LAB_001140d8:
      FAudio_PlatformUnlockMutex(voice->sendLock);
      return;
    }
    pFVar1 = (voice->sends).pSends;
    if (pDestinationVoice == *(FAudioVoice **)((long)&pFVar1->pOutputVoice + lVar3)) {
      if ((*(byte *)((long)&pFVar1->Flags + lVar3) & 0x80) != 0) {
        SDL_memcpy(pParameters,(long)&voice->sendFilter->Type + lVar3,0xc);
      }
      goto LAB_001140d8;
    }
    lVar3 = lVar3 + 0xc;
  } while( true );
}

Assistant:

void FAudioVoice_GetOutputFilterParameters(
	FAudioVoice *voice,
	FAudioVoice *pDestinationVoice,
	FAudioFilterParameters *pParameters
) {
	uint32_t i;

	LOG_API_ENTER(voice->audio)

	/* MSDN: "This method is usable only on source and submix voices and
	 * has no effect on mastering voices."
	 */
	if (voice->type == FAUDIO_VOICE_MASTER)
	{
		LOG_API_EXIT(voice->audio)
		return;
	}

	FAudio_PlatformLockMutex(voice->sendLock);
	LOG_MUTEX_LOCK(voice->audio, voice->sendLock)

	/* Find the send index */
	if (pDestinationVoice == NULL && voice->sends.SendCount == 1)
	{
		pDestinationVoice = voice->sends.pSends[0].pOutputVoice;
	}
	for (i = 0; i < voice->sends.SendCount; i += 1)
	{
		if (pDestinationVoice == voice->sends.pSends[i].pOutputVoice)
		{
			break;
		}
	}
	if (i >= voice->sends.SendCount)
	{
		LOG_ERROR(
			voice->audio,
			"Destination not attached to source: %p %p",
			(void*) voice,
			(void*) pDestinationVoice
		)
		FAudio_PlatformUnlockMutex(voice->sendLock);
		LOG_MUTEX_UNLOCK(voice->audio, voice->sendLock)
		LOG_API_EXIT(voice->audio)
		return;
	}

	if (!(voice->sends.pSends[i].Flags & FAUDIO_SEND_USEFILTER))
	{
		FAudio_PlatformUnlockMutex(voice->sendLock);
		LOG_MUTEX_UNLOCK(voice->audio, voice->sendLock)
		LOG_API_EXIT(voice->audio)
		return;
	}

	/* Set the filter parameters, finally. */
	FAudio_memcpy(
		pParameters,
		&voice->sendFilter[i],
		sizeof(FAudioFilterParameters)
	);

	FAudio_PlatformUnlockMutex(voice->sendLock);
	LOG_MUTEX_UNLOCK(voice->audio, voice->sendLock)
	LOG_API_EXIT(voice->audio)
}